

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::AddField
          (Parser *this,StructDef *struct_def,string *name,Type *type,FieldDef **dest)

{
  bool bVar1;
  voffset_t vVar2;
  FieldDef *this_00;
  size_type_conflict sVar3;
  unsigned_long *puVar4;
  FieldDef *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  size_t local_60;
  size_t alignment;
  size_t size;
  FieldDef *local_40;
  FieldDef *field;
  FieldDef **dest_local;
  Type *type_local;
  string *name_local;
  StructDef *struct_def_local;
  Parser *this_local;
  
  field = in_R9;
  dest_local = dest;
  type_local = type;
  name_local = name;
  struct_def_local = struct_def;
  this_local = this;
  this_00 = (FieldDef *)operator_new(0x138);
  FieldDef::FieldDef(this_00);
  local_40 = this_00;
  sVar3 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::size
                    ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                     ((long)&name_local[7].field_2 + 8));
  vVar2 = FieldIndexToOffset((voffset_t)sVar3);
  (local_40->value).offset = vVar2;
  std::__cxx11::string::operator=((string *)local_40,(string *)type_local);
  std::__cxx11::string::operator=
            ((string *)&(local_40->super_Definition).file,(string *)(name_local + 1));
  *(FieldDef **)&(local_40->value).type = *dest_local;
  (local_40->value).type.struct_def = (StructDef *)dest_local[1];
  (local_40->value).type.enum_def = (EnumDef *)dest_local[2];
  (local_40->value).type.fixed_length = *(uint16_t *)(dest_local + 3);
  if ((name_local[8].field_2._M_local_buf[0] & 1U) != 0) {
    alignment = InlineSize((Type *)dest_local);
    local_60 = InlineAlignment((Type *)dest_local);
    puVar4 = std::max<unsigned_long>
                       ((unsigned_long *)(name_local[8].field_2._M_local_buf + 8),&local_60);
    *(unsigned_long *)((long)&name_local[8].field_2 + 8) = *puVar4;
    StructDef::PadLastField((StructDef *)name_local,local_60);
    (local_40->value).offset = (voffset_t)*(undefined8 *)(name_local + 9);
    *(size_t *)(name_local + 9) = alignment + *(long *)(name_local + 9);
  }
  bVar1 = SymbolTable<flatbuffers::FieldDef>::Add
                    ((SymbolTable<flatbuffers::FieldDef> *)&name_local[6]._M_string_length,
                     (string *)type_local,local_40);
  if (bVar1) {
    std::operator+(&local_80,"field already exists: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_local);
    Error(this,(string *)struct_def);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    *(FieldDef **)&(field->super_Definition).name = local_40;
    anon_unknown_0::NoError();
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::AddField(StructDef &struct_def, const std::string &name,
                              const Type &type, FieldDef **dest) {
  auto &field = *new FieldDef();
  field.value.offset =
      FieldIndexToOffset(static_cast<voffset_t>(struct_def.fields.vec.size()));
  field.name = name;
  field.file = struct_def.file;
  field.value.type = type;
  if (struct_def.fixed) {  // statically compute the field offset
    auto size = InlineSize(type);
    auto alignment = InlineAlignment(type);
    // structs_ need to have a predictable format, so we need to align to
    // the largest scalar
    struct_def.minalign = std::max(struct_def.minalign, alignment);
    struct_def.PadLastField(alignment);
    field.value.offset = static_cast<voffset_t>(struct_def.bytesize);
    struct_def.bytesize += size;
  }
  if (struct_def.fields.Add(name, &field))
    return Error("field already exists: " + name);
  *dest = &field;
  return NoError();
}